

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void wl_keyboard_handle_key
               (void *data,wl_keyboard *keyboard,uint serial,uint time,uint key,uint state)

{
  xkb_keysym_t xVar1;
  char *pcVar2;
  undefined4 in_register_0000000c;
  undefined8 uVar3;
  bool bVar4;
  xkb_keysym_t *syms;
  
  if (state == 0) {
    return;
  }
  uVar3 = *(undefined8 *)((long)data + 0x48);
  xkb_state_key_get_syms(uVar3,key + 8,&syms,CONCAT44(in_register_0000000c,time));
  xVar1 = *syms;
  switch(xVar1) {
  case 0xff51:
    view_ry = view_ry + 5.0;
    break;
  case 0xff52:
    view_rx = view_rx + 5.0;
    break;
  case 0xff53:
    view_ry = view_ry + -5.0;
    break;
  case 0xff54:
    view_rx = view_rx + -5.0;
    break;
  case 0xff55:
    view_tz = view_tz + -5.0;
    break;
  case 0xff56:
    view_tz = view_tz + 5.0;
    break;
  default:
    if (xVar1 == 0x20) {
      bVar4 = animate == 0;
      animate = (uint)bVar4;
      redisplay = !bVar4;
      return;
    }
    if (xVar1 != 0x74) {
      if (xVar1 != 0xff1b) {
        return;
      }
      sighandler((int)uVar3);
      return;
    }
    pcVar2 = getenv("NO_TEXTURE");
    if (pcVar2 == (char *)0x0) {
      setenv("NO_TEXTURE","1",1);
    }
    else {
      unsetenv("NO_TEXTURE");
    }
  }
  if (animate == 0) {
    redisplay = 0;
  }
  return;
}

Assistant:

static void wl_keyboard_handle_key(void *data, struct wl_keyboard *keyboard, unsigned int serial, unsigned int time, unsigned int key, unsigned int state)
{
  struct wl_data *wl_data = data;
  const xkb_keysym_t *syms;

  if (state == WL_KEYBOARD_KEY_STATE_RELEASED)
    return;

  xkb_key_get_syms(wl_data->xkb_state, key + 8, &syms);

  switch (syms[0]) {
    case XKB_KEY_Escape:
      sighandler(SIGTERM);
      return;
    case XKB_KEY_space:
      animate = !animate;
      if (animate) {
        redisplay = 1;
      }
      else {
        redisplay = 0;
      }
      return;
    case XKB_KEY_Page_Down:
      view_tz -= -5.0;
      break;
    case XKB_KEY_Page_Up:
      view_tz += -5.0;
      break;
    case XKB_KEY_Down:
      view_rx -= 5.0;
      break;
    case XKB_KEY_Up:
      view_rx += 5.0;
      break;
    case XKB_KEY_Right:
      view_ry -= 5.0;
      break;
    case XKB_KEY_Left:
      view_ry += 5.0;
      break;
    case XKB_KEY_t:
      if (getenv("NO_TEXTURE")) {
        unsetenv("NO_TEXTURE");
      }
      else {
        setenv("NO_TEXTURE", "1", 1);
      }
      break;
    default:
      return;
  }

  if (!animate) {
    redisplay = 1;
  }
}